

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdaptorTest.cpp
# Opt level: O2

void __thiscall AdaptorTest_StackTest_Test::TestBody(AdaptorTest_StackTest_Test *this)

{
  DataBlock **ppDVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  char *in_R9;
  AssertHelper local_110;
  int local_104;
  AssertionResult gtest_ar_;
  AssertHelper local_f0;
  AssertionResult gtest_ar;
  stack<int,_Deque<int,_std::allocator<int>_>_> s;
  
  std::stack<int,Deque<int,std::allocator<int>>>::stack<Deque<int,std::allocator<int>>,void>
            ((stack<int,Deque<int,std::allocator<int>>> *)&s.c);
  for (gtest_ar._0_4_ = 0; (int)gtest_ar._0_4_ < 100; gtest_ar._0_4_ = gtest_ar._0_4_ + 1) {
    Deque<int,_std::allocator<int>_>::push_back(&s.c,(value_type *)&gtest_ar);
  }
  local_104 = 99;
  this_00 = &gtest_ar.message_;
  do {
    if (local_104 < 0) {
LAB_00133f18:
      Deque<int,_std::allocator<int>_>::~Deque(&s.c);
      return;
    }
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = s.c.current_.size_ != 0;
    if (s.c.current_.size_ == 0) {
      testing::Message::Message((Message *)&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"s.empty()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/AdaptorTest.cpp"
                 ,0x11,(char *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_));
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_110);
      this_00 = &gtest_ar_.message_;
LAB_00133f13:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(this_00);
      goto LAB_00133f18;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    ppDVar1 = s.c.current_.arr_ + s.c.current_.allocSize_;
    if (s.c.current_.end_ != s.c.current_.arr_) {
      ppDVar1 = s.c.current_.end_;
    }
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"s.top()","i",ppDVar1[-1]->end + -1,&local_104);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/AdaptorTest.cpp"
                 ,0x12,message);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
      goto LAB_00133f13;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(this_00);
    Deque<int,_std::allocator<int>_>::pop_back(&s.c);
    local_104 = local_104 + -1;
  } while( true );
}

Assistant:

TEST(AdaptorTest, StackTest) {
    std::stack<int, Deque<int>> s;
    for (int i = 0; i < 100; ++i) {
        s.push(i);
    }

    for (int i = 99; i >= 0; --i) {
        ASSERT_FALSE(s.empty());
        ASSERT_EQ(s.top(), i);
        s.pop();
    }
}